

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseEncoding(State *state)

{
  ParseState *pPVar1;
  undefined1 *puVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (0x1ffff < iVar4 || 0xff < iVar3) {
    bVar8 = false;
    goto LAB_00151932;
  }
  bVar7 = ParseName(state);
  if (bVar7) {
    bVar8 = true;
    ParseBareFunctionType(state);
    goto LAB_00151932;
  }
  iVar3 = state->recursion_depth;
  iVar4 = state->steps;
  state->recursion_depth = iVar3 + 1;
  state->steps = iVar4 + 1;
  if (iVar4 < 0x20000 && iVar3 < 0x100) {
    iVar3 = (state->parse_state).prev_name_idx;
    uVar5 = (state->parse_state).mangled_idx;
    uVar6 = (state->parse_state).out_cur_idx;
    uVar9 = *(uint *)&(state->parse_state).field_0xc;
    bVar7 = ParseOneCharToken(state,'T');
    if (bVar7) {
      bVar7 = ParseCharClass(state,"VTISH");
      if (bVar7) {
        bVar7 = ParseType(state);
        bVar8 = true;
        if (bVar7) goto LAB_0015192f;
      }
    }
    pPVar1 = &state->parse_state;
    (state->parse_state).prev_name_idx = iVar3;
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(uint *)&(state->parse_state).field_0xc = uVar9;
    bVar7 = ParseTwoCharToken(state,"Tc");
    if (bVar7) {
      bVar7 = ParseCallOffset(state);
      if (bVar7) {
        bVar7 = ParseCallOffset(state);
        if (bVar7) {
          bVar7 = ParseEncoding(state);
          bVar8 = true;
          if (bVar7) goto LAB_0015192f;
        }
      }
    }
    (state->parse_state).prev_name_idx = iVar3;
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(uint *)&(state->parse_state).field_0xc = uVar9;
    bVar7 = ParseTwoCharToken(state,"GV");
    if (bVar7) {
      bVar7 = ParseName(state);
      bVar8 = true;
      if (bVar7) goto LAB_0015192f;
    }
    (state->parse_state).prev_name_idx = iVar3;
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(uint *)&(state->parse_state).field_0xc = uVar9;
    bVar7 = ParseOneCharToken(state,'T');
    if (bVar7) {
      bVar7 = ParseCallOffset(state);
      if (bVar7) {
        bVar7 = ParseEncoding(state);
        bVar8 = true;
        if (bVar7) goto LAB_0015192f;
      }
    }
    (state->parse_state).prev_name_idx = iVar3;
    pPVar1->mangled_idx = uVar5;
    pPVar1->out_cur_idx = uVar6;
    *(uint *)&(state->parse_state).field_0xc = uVar9;
    bVar7 = ParseTwoCharToken(state,"TC");
    if (bVar7) {
      bVar7 = ParseType(state);
      if (!bVar7) goto LAB_0015180b;
      bVar7 = ParseNumber(state,(int *)0x0);
      if (!bVar7) goto LAB_0015180b;
      bVar7 = ParseOneCharToken(state,'_');
      if (!bVar7) goto LAB_0015180b;
      puVar2 = &(state->parse_state).field_0xf;
      *puVar2 = *puVar2 & 0x7f;
      bVar7 = ParseType(state);
      if (!bVar7) goto LAB_0015180b;
      uVar9 = uVar9 & 0x80000000 | *(uint *)&(state->parse_state).field_0xc & 0x7fffffff;
      bVar8 = true;
    }
    else {
LAB_0015180b:
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar9;
      bVar7 = ParseOneCharToken(state,'T');
      if (bVar7) {
        bVar7 = ParseCharClass(state,"FJ");
        if (bVar7) {
          bVar7 = ParseType(state);
          bVar8 = true;
          if (bVar7) goto LAB_0015192f;
        }
      }
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar9;
      bVar7 = ParseTwoCharToken(state,"GR");
      if (bVar7) {
        bVar7 = ParseName(state);
        bVar8 = true;
        if (bVar7) goto LAB_0015192f;
      }
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar9;
      bVar7 = ParseTwoCharToken(state,"GA");
      if (bVar7) {
        bVar7 = ParseEncoding(state);
        bVar8 = true;
        if (bVar7) goto LAB_0015192f;
      }
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      *(uint *)&(state->parse_state).field_0xc = uVar9;
      bVar7 = ParseOneCharToken(state,'T');
      if (bVar7) {
        bVar7 = ParseCharClass(state,"hv");
        if (bVar7) {
          bVar7 = ParseCallOffset(state);
          if (bVar7) {
            bVar7 = ParseEncoding(state);
            bVar8 = true;
            if (bVar7) goto LAB_0015192f;
          }
        }
      }
      (state->parse_state).prev_name_idx = iVar3;
      pPVar1->mangled_idx = uVar5;
      pPVar1->out_cur_idx = uVar6;
      bVar8 = false;
    }
    *(uint *)&(state->parse_state).field_0xc = uVar9;
  }
  else {
    bVar8 = false;
  }
LAB_0015192f:
  state->recursion_depth = state->recursion_depth + -1;
LAB_00151932:
  state->recursion_depth = state->recursion_depth + -1;
  return bVar8;
}

Assistant:

static bool ParseEncoding(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  // Implementing the first two productions together as <name>
  // [<bare-function-type>] avoids exponential blowup of backtracking.
  //
  // Since Optional(...) can't fail, there's no need to copy the state for
  // backtracking.
  if (ParseName(state) && Optional(ParseBareFunctionType(state))) {
    return true;
  }

  if (ParseSpecialName(state)) {
    return true;
  }
  return false;
}